

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::Trans4x4WHT_MemCheck_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::Trans4x4WHT_MemCheck_Test> *this)

{
  undefined8 *puVar1;
  
  WithParamInterface<std::tuple<void(*)(short_const*,int*,int),void(*)(int_const*,unsigned_char*,int),unsigned_char,aom_bit_depth,int,void(*)(short_const*,int*,int)>>
  ::parameter_ = &this->parameter_;
  puVar1 = (undefined8 *)operator_new(0x78);
  *puVar1 = &PTR__TransformTestBase_0105d660;
  Test::Test((Test *)(puVar1 + 9));
  *puVar1 = &PTR__Trans4x4WHT_0105f3b8;
  puVar1[9] = &PTR__Trans4x4WHT_MemCheck_Test_0105f3f8;
  puVar1[0xb] = &PTR__Trans4x4WHT_MemCheck_Test_0105f438;
  return (Test *)(puVar1 + 9);
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }